

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBarBufsToBuffers(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int iVar2;
  long lVar3;
  int i;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1ae,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    __assert_fail("pNtk->pDesign == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1af,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1b0,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != pNtk->nObjCounts[8]) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1b1,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  p = Abc_NtkToBarBufsCollect(pNtk);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
  pcVar1 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar1;
  pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar1;
  Abc_NtkCleanCopy(pNtk);
  i = 0;
  iVar2 = p->nSize;
  if (p->nSize < 1) {
    iVar2 = 0;
  }
  do {
    if (i == iVar2) {
      Vec_PtrFree(p);
      return pNtk_00;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p,i);
    switch(*(uint *)&pObj->field_0x14 & 0xf) {
    case 2:
      Abc_NtkDupObj(pNtk_00,pObj,1);
      break;
    case 3:
      pObj_00 = Abc_NtkDupObj(pNtk_00,pObj,1);
      goto LAB_001c0ac1;
    case 4:
    case 5:
      pObj->field_6 =
           *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
            ((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x40);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                    ,0x1c9,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
    case 7:
      Abc_NtkDupObj(pNtk_00,pObj,1);
      for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
        Abc_ObjAddFanin((pObj->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]] + 0x40));
      }
      break;
    case 8:
      pObj_00 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
      (pObj->field_6).pCopy = pObj_00;
LAB_001c0ac1:
      Abc_ObjAddFanin(pObj_00,*(Abc_Obj_t **)
                               ((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x40));
    }
    i = i + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsToBuffers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->pDesign == NULL );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Abc_NtkToBarBufsCollect( pNtk );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // create objects
    Abc_NtkCleanCopy( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsPi(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
        else if ( Abc_ObjIsPo( pObj) )
            Abc_ObjAddFanin( Abc_NtkDupObj(pNtkNew, pObj, 1), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsBi(pObj) || Abc_ObjIsBo(pObj) )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        else if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( (pObj->pCopy = Abc_NtkCreateNode(pNtkNew)), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsNode(pObj) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
        else assert( 0 );
    }
    Vec_PtrFree( vNodes );
    return pNtkNew;
}